

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

bool __thiscall
Js::FunctionExecutionStateMachine::TryTransitionToNextExecutionMode
          (FunctionExecutionStateMachine *this)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint32 uVar4;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar5;
  uint16 *limit;
  FunctionBody *pFVar6;
  FunctionEntryPointInfo *pFVar7;
  byte local_39;
  ExecutionState local_29;
  ExecutionState newState;
  FunctionEntryPointInfo *simpleJitEntryPointInfo;
  uint16 *stateLimit;
  bool isTransitionNeeded;
  bool isStateChanged;
  FunctionExecutionStateMachine *this_local;
  
  if ((this->initializedExecutionModeAndLimits & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x21c,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (this->executionState != FullJit) {
    limit = GetStateLimit(this,this->executionState);
    pFVar6 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
    pFVar7 = FunctionBody::GetSimpleJitEntryPointInfo(pFVar6);
    if (((this->executionState == SimpleJit) || (uVar4 = GetInterpretedCount(this), *limit <= uVar4)
        ) && ((pFVar7 == (FunctionEntryPointInfo *)0x0 || (pFVar7->callsCount == 0)))) {
      CommitExecutedIterations(this,limit,(uint)*limit);
      SetInterpretedCount(this,0);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    if (bVar2) {
      local_29 = this->executionState;
      do {
        while( true ) {
          local_39 = 0;
          if (bVar2) {
            bVar3 = IsTerminalState(this,local_29);
            local_39 = bVar3 ^ 0xff;
          }
          if ((local_39 & 1) == 0) {
            if (!bVar2) {
              return false;
            }
            bVar2 = IsTerminalState(this,local_29);
            if (!bVar2) {
              return false;
            }
            if (local_29 == this->executionState) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                          ,0x25e,"(newState != executionState)",
                                          "newState != executionState");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
            SetExecutionState(this,local_29);
            return true;
          }
          if (local_29 == Interpreter) {
            local_29 = FullJit;
          }
          else {
            local_29 = local_29 + AutoProfilingInterpreter0;
          }
          if (local_29 == FullJit) break;
LAB_00a50155:
          bVar2 = true;
        }
        pFVar6 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
        sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar6);
        pFVar6 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
        functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar6);
        bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,FullJitPhase,sourceContextId,functionId);
        if (!bVar2) goto LAB_00a50155;
        bVar2 = false;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool FunctionExecutionStateMachine::TryTransitionToNextExecutionMode()
    {
        Assert(initializedExecutionModeAndLimits);

        bool isStateChanged = false;
        if (executionState != ExecutionState::FullJit)
        {
            bool isTransitionNeeded;
            uint16& stateLimit = GetStateLimit(executionState);
            FunctionEntryPointInfo *const simpleJitEntryPointInfo = owner->GetSimpleJitEntryPointInfo();

            // Determine if the current state should not transition when
            // - for non-JITed states, the interpreted count is less than the limit
            // - for JITed states (specifically, SimpleJIT because it can transition), the callsCount
            //   is non-zero. CallsCount starts at the limit and decrements to 0 to indicate transition.
            if ((executionState != ExecutionState::SimpleJit && GetInterpretedCount() < stateLimit)
                || (simpleJitEntryPointInfo != nullptr && simpleJitEntryPointInfo->callsCount > 0))
            {
                // Since the current state is under its limit, no transition is needed.
                // Simply verify the current state's execution mode before returning.
                isTransitionNeeded = false;
            }
            else
            {
                // Since the current state's limit is reached, transition from this state to the next state
                // First, save data from the current state
                CommitExecutedIterations(stateLimit, stateLimit);

                // Then, reset data for the next state
                SetInterpretedCount(0);

                isTransitionNeeded = true;
            }

            if (isTransitionNeeded)
            {
                // Keep advancing the state until a terminal state is found or until there are no more 
                // states to reach. The path of advancement is described in the banner comment above.
                ExecutionState newState = executionState;
                while (isTransitionNeeded && !IsTerminalState(newState))
                {
                    if (newState != ExecutionState::Interpreter)
                    {
                        // Most states simply advance to the next state
                        newState = static_cast<ExecutionState>(static_cast<uint8>(newState) + 1);
                    }
                    else
                    {
                        // Interpreter advances straight to FullJit
                        newState = ExecutionState::FullJit;
                    }

                    // If FullJit is the next state, but FullJit is disabled, then no transition
                    // is needed.
                    if (newState == ExecutionState::FullJit && PHASE_OFF(FullJitPhase, owner))
                    {
                        isTransitionNeeded = false;
                    }
                    else
                    {
                        // Otherwise, transition is needed because there is new state available
                        isTransitionNeeded = true;
                    }
                }

                // Only update the execution state when the new state is a terminal state
                if (isTransitionNeeded && IsTerminalState(newState))
                {
                    Assert(newState != executionState);
                    SetExecutionState(newState);
                    isStateChanged = true;
                }
            }
        }

        return isStateChanged;
    }